

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

target_ulong_conflict
helper_divweu_ppc(CPUPPCState_conflict *env,target_ulong_conflict ra,target_ulong_conflict rb,
                 uint32_t oe)

{
  ulong uVar1;
  target_ulong_conflict tVar2;
  
  if (rb == 0) {
LAB_00a91cd3:
    if (oe == 0) {
      return 0;
    }
    env->so = 1;
    tVar2 = 1;
    uVar1 = 0;
  }
  else {
    tVar2 = 0;
    uVar1 = ((ulong)ra << 0x20) / (ulong)rb;
    if (uVar1 >> 0x20 != 0) goto LAB_00a91cd3;
    if (oe == 0) goto LAB_00a91cd2;
  }
  env->ov = tVar2;
LAB_00a91cd2:
  return (target_ulong_conflict)uVar1;
}

Assistant:

target_ulong helper_divweu(CPUPPCState *env, target_ulong ra, target_ulong rb,
                           uint32_t oe)
{
    uint64_t rt = 0;
    int overflow = 0;

    uint64_t dividend = (uint64_t)ra << 32;
    uint64_t divisor = (uint32_t)rb;

    if (unlikely(divisor == 0)) {
        overflow = 1;
    } else {
        rt = dividend / divisor;
        overflow = rt > UINT32_MAX;
    }

    if (unlikely(overflow)) {
        rt = 0; /* Undefined */
    }

    if (oe) {
        helper_update_ov_legacy(env, overflow);
    }

    return (target_ulong)rt;
}